

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Simplex_tree_vec_fil>::
insert_node_<true,false,true,Gudhi::Vector_filtration_value_const&>
          (Simplex_tree<Simplex_tree_vec_fil> *this,Siblings *sib,Vertex_handle v,
          Vector_filtration_value *filtration_value)

{
  bool bVar1;
  undefined4 in_register_00000014;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_false>,_bool>
  *ret_val;
  Vector_filtration_value *in_R8;
  pair<boost::container::vec_iterator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_false>,_bool>
  pVar3;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_false>,_bool>
  pVar4;
  undefined4 local_3c;
  undefined1 local_38 [16];
  __buckets_ptr local_28;
  char local_20;
  
  local_38._0_8_ = CONCAT44(in_register_00000014,v);
  local_3c = SUB84(filtration_value,0);
  local_38._8_8_ = (pointer)0x0;
  pVar3 = boost::container::dtl::
          flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>>>>
          ::
          try_emplace<int_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>,std::less<int>,void>>*&,Gudhi::Vector_filtration_value_const&>
                    ((flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>>>>
                      *)&local_28,(const_iterator *)(local_38._0_8_ + 0x10),(int *)(local_38 + 8),
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>_>
                      **)&local_3c,(Vector_filtration_value *)local_38);
  uVar2 = pVar3._8_8_;
  (this->nodes_label_to_list_)._M_h._M_buckets = local_28;
  *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_20;
  if (local_20 == '\0') {
    bVar1 = unify_lifetimes((Vector_filtration_value *)(local_28 + 1),in_R8);
    uVar2 = extraout_RDX;
    if (!bVar1) {
      (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    }
  }
  pVar4._8_8_ = uVar2;
  pVar4.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
        *)this;
  return pVar4;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }